

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

XMLURL * __thiscall xercesc_4_0::XMLURL::operator=(XMLURL *this,XMLURL *toAssign)

{
  MemoryManager *manager;
  Protocols PVar1;
  XMLCh *pXVar2;
  
  if (this != toAssign) {
    cleanUp(this);
    manager = toAssign->fMemoryManager;
    this->fMemoryManager = manager;
    pXVar2 = XMLString::replicate(toAssign->fFragment,manager);
    this->fFragment = pXVar2;
    pXVar2 = XMLString::replicate(toAssign->fHost,this->fMemoryManager);
    this->fHost = pXVar2;
    pXVar2 = XMLString::replicate(toAssign->fPassword,this->fMemoryManager);
    this->fPassword = pXVar2;
    pXVar2 = XMLString::replicate(toAssign->fPath,this->fMemoryManager);
    this->fPath = pXVar2;
    PVar1 = toAssign->fProtocol;
    this->fPortNum = toAssign->fPortNum;
    this->fProtocol = PVar1;
    pXVar2 = XMLString::replicate(toAssign->fQuery,this->fMemoryManager);
    this->fQuery = pXVar2;
    pXVar2 = XMLString::replicate(toAssign->fUser,this->fMemoryManager);
    this->fUser = pXVar2;
    pXVar2 = XMLString::replicate(toAssign->fURLText,this->fMemoryManager);
    this->fURLText = pXVar2;
    this->fHasInvalidChar = toAssign->fHasInvalidChar;
  }
  return this;
}

Assistant:

XMLURL& XMLURL::operator=(const XMLURL& toAssign)
{
    if (this == &toAssign)
        return *this;

    // Clean up our stuff
    cleanUp();

    // And copy his stuff
    fMemoryManager = toAssign.fMemoryManager;
    fFragment = XMLString::replicate(toAssign.fFragment, fMemoryManager);
    fHost = XMLString::replicate(toAssign.fHost, fMemoryManager);
    fPassword = XMLString::replicate(toAssign.fPassword, fMemoryManager);
    fPath = XMLString::replicate(toAssign.fPath, fMemoryManager);
    fPortNum = toAssign.fPortNum;
    fProtocol = toAssign.fProtocol;
    fQuery = XMLString::replicate(toAssign.fQuery, fMemoryManager);
    fUser = XMLString::replicate(toAssign.fUser, fMemoryManager);
    fURLText = XMLString::replicate(toAssign.fURLText, fMemoryManager);
    fHasInvalidChar = toAssign.fHasInvalidChar;

    return *this;
}